

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct64_stage5_high48_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i *in_XMM0_Qb;
  __m256i *in_YMM0_H;
  __m256i cospi_m24_m40;
  __m256i cospi_p24_p40;
  __m256i cospi_m40_p24;
  __m256i cospi_m56_m08;
  __m256i cospi_p56_p08;
  __m256i cospi_m08_p56;
  __m256i *in_stack_000000c8;
  __m256i *in_stack_000000d0;
  undefined7 in_stack_000000d8;
  longlong in_stack_00000110;
  undefined4 uVar1;
  undefined8 in_stack_fffffffffffffed0;
  
  uVar1 = (undefined4)in_stack_fffffffffffffed0;
  pair_set_w16_epi16((int16_t)((ulong)in_stack_fffffffffffffed0 >> 0x10),
                     (int16_t)in_stack_fffffffffffffed0);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  w0[1] = (longlong)cospi;
  w0[0] = _r[3];
  w0[2] = (longlong)x;
  w0[3] = in_stack_00000110;
  w1[0]._7_1_ = cos_bit;
  w1[0]._0_7_ = in_stack_000000d8;
  w1[1] = _r[0];
  w1[2] = _r[1];
  w1[3] = _r[2];
  btf_16_w16_avx2(w0,w1,in_stack_000000d0,in_stack_000000c8,(__m256i)stack0x00000098,
                  cospi_p56_p08[2]._4_4_);
  w0_00[1] = (longlong)cospi;
  w0_00[0] = _r[3];
  w0_00[2] = (longlong)x;
  w0_00[3] = in_stack_00000110;
  w1_00[0]._7_1_ = cos_bit;
  w1_00[0]._0_7_ = in_stack_000000d8;
  w1_00[1] = _r[0];
  w1_00[2] = _r[1];
  w1_00[3] = _r[2];
  btf_16_w16_avx2(w0_00,w1_00,in_stack_000000d0,in_stack_000000c8,(__m256i)stack0x00000098,
                  cospi_p56_p08[2]._4_4_);
  w0_01[1] = (longlong)cospi;
  w0_01[0] = _r[3];
  w0_01[2] = (longlong)x;
  w0_01[3] = in_stack_00000110;
  w1_01[0]._7_1_ = cos_bit;
  w1_01[0]._0_7_ = in_stack_000000d8;
  w1_01[1] = _r[0];
  w1_01[2] = _r[1];
  w1_01[3] = _r[2];
  btf_16_w16_avx2(w0_01,w1_01,in_stack_000000d0,in_stack_000000c8,(__m256i)stack0x00000098,
                  cospi_p56_p08[2]._4_4_);
  w0_02[1] = (longlong)cospi;
  w0_02[0] = _r[3];
  w0_02[2] = (longlong)x;
  w0_02[3] = in_stack_00000110;
  w1_02[0]._7_1_ = cos_bit;
  w1_02[0]._0_7_ = in_stack_000000d8;
  w1_02[1] = _r[0];
  w1_02[2] = _r[1];
  w1_02[3] = _r[2];
  btf_16_w16_avx2(w0_02,w1_02,in_stack_000000d0,in_stack_000000c8,(__m256i)stack0x00000098,
                  cospi_p56_p08[2]._4_4_);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  btf_16_adds_subs_avx2(in_YMM0_H,in_XMM0_Qb);
  return;
}

Assistant:

static inline void idct64_stage5_high48_avx2(__m256i *x, const int32_t *cospi,
                                             const __m256i _r, int8_t cos_bit) {
  (void)cos_bit;
  const __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  const __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  const __m256i cospi_m56_m08 = pair_set_w16_epi16(-cospi[56], -cospi[8]);
  const __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);
  const __m256i cospi_p24_p40 = pair_set_w16_epi16(cospi[24], cospi[40]);
  const __m256i cospi_m24_m40 = pair_set_w16_epi16(-cospi[24], -cospi[40]);
  btf_16_w16_avx2(cospi_m08_p56, cospi_p56_p08, &x[17], &x[30], _r, cos_bit);
  btf_16_w16_avx2(cospi_m56_m08, cospi_m08_p56, &x[18], &x[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_m40_p24, cospi_p24_p40, &x[21], &x[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_m24_m40, cospi_m40_p24, &x[22], &x[25], _r, cos_bit);
  btf_16_adds_subs_avx2(&x[32], &x[35]);
  btf_16_adds_subs_avx2(&x[33], &x[34]);
  btf_16_adds_subs_avx2(&x[39], &x[36]);
  btf_16_adds_subs_avx2(&x[38], &x[37]);
  btf_16_adds_subs_avx2(&x[40], &x[43]);
  btf_16_adds_subs_avx2(&x[41], &x[42]);
  btf_16_adds_subs_avx2(&x[47], &x[44]);
  btf_16_adds_subs_avx2(&x[46], &x[45]);
  btf_16_adds_subs_avx2(&x[48], &x[51]);
  btf_16_adds_subs_avx2(&x[49], &x[50]);
  btf_16_adds_subs_avx2(&x[55], &x[52]);
  btf_16_adds_subs_avx2(&x[54], &x[53]);
  btf_16_adds_subs_avx2(&x[56], &x[59]);
  btf_16_adds_subs_avx2(&x[57], &x[58]);
  btf_16_adds_subs_avx2(&x[63], &x[60]);
  btf_16_adds_subs_avx2(&x[62], &x[61]);
}